

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O1

void __thiscall dynamicgraph::OutStringStream::~OutStringStream(OutStringStream *this)

{
  ~OutStringStream(this,&VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0xb0);
  operator_delete(this,0x1b8);
  return;
}

Assistant:

OutStringStream::~OutStringStream() {
  dgDEBUGIN(15);
  delete[] buffer;
  dgDEBUGOUT(15);
}